

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

string * __thiscall
helics::CoreBroker::query_abi_cxx11_
          (CoreBroker *this,string_view target,string_view queryStr,HelicsSequencingModes mode)

{
  string_view string1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  string_view request;
  string_view request_00;
  bool bVar1;
  BrokerState BVar2;
  element_type *this_00;
  char *in_RCX;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  CoreBroker *in_RSI;
  SmallBuffer *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult;
  __int_type_conflict index;
  ActionMessage querycmd;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_3;
  __int_type_conflict index_2;
  ActionMessage querycmd_3;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_2;
  ActionMessage querycmd_2;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_1;
  __int_type_conflict index_1;
  ActionMessage querycmd_1;
  string res_1;
  GlobalBrokerId gid;
  json base;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  ActionMessage *in_stack_fffffffffffff9a8;
  BrokerBase *in_stack_fffffffffffff9b0;
  ActionMessage *in_stack_fffffffffffff9b8;
  CoreBroker *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  action_t in_stack_fffffffffffff9cc;
  undefined7 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d7;
  SmallBuffer *__a;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  undefined4 in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  undefined4 in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa04;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa10;
  JsonErrorCodes code;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  undefined4 in_stack_fffffffffffffa20;
  GlobalFederateId in_stack_fffffffffffffa24;
  undefined1 in_stack_fffffffffffffa87;
  json *in_stack_fffffffffffffa88;
  BrokerBase *in_stack_fffffffffffffa90;
  GlobalFederateId local_4fc [2];
  __int_type_conflict local_4f4;
  BaseType local_4f0;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_430;
  char *local_428;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_410;
  char *local_408;
  undefined1 local_3f9;
  BaseType local_3e8;
  GlobalFederateId local_3e4 [2];
  __int_type_conflict local_3dc;
  BaseType local_3d8;
  allocator<char> local_321 [33];
  CoreBroker *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  char *in_stack_fffffffffffffd10;
  GlobalFederateId local_2bc [2];
  __int_type_conflict local_2b4;
  BaseType local_2b0;
  BaseType local_2a8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  __sv_type local_190;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_180;
  char *local_178;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_160;
  char *local_158;
  GlobalBrokerId local_150;
  allocator<char> local_149 [81];
  undefined8 local_f8;
  undefined8 local_f0;
  int local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  char *local_98;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  char *local_78;
  __sv_type local_70;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  char *local_58;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  char *local_38;
  undefined8 local_28;
  undefined8 local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  code = (JsonErrorCodes)((ulong)in_stack_fffffffffffffa10 >> 0x20);
  __a = in_RDI;
  local_28 = in_R8;
  local_20 = in_R9;
  local_18._M_len = (size_t)in_RDX;
  local_18._M_str = in_RCX;
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x5fc641);
  if (BVar2 < TERMINATING) {
    local_150 = CLI::std::atomic<helics::GlobalBrokerId>::load
                          (&(in_RSI->super_BrokerBase).global_id,seq_cst);
    local_160 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_18._M_len;
    local_158 = local_18._M_str;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c0,
               (char *)in_stack_fffffffffffff9b8);
    __x_04._M_str = (char *)__a;
    __x_04._M_len = (size_t)in_RDI;
    __y_04._M_len._4_4_ = in_stack_fffffffffffff9cc;
    __y_04._M_len._0_4_ = in_stack_fffffffffffff9c8;
    __y_04._M_str._0_7_ = in_stack_fffffffffffff9d0;
    __y_04._M_str._7_1_ = in_stack_fffffffffffff9d7;
    bVar1 = std::operator==(__x_04,__y_04);
    if (!bVar1) {
      local_180 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_18._M_len;
      local_178 = local_18._M_str;
      getIdentifier_abi_cxx11_(in_RSI);
      local_190 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff9b0);
      __x_05._M_str = (char *)__a;
      __x_05._M_len = (size_t)in_RDI;
      __y_05._M_len._4_4_ = in_stack_fffffffffffff9cc;
      __y_05._M_len._0_4_ = in_stack_fffffffffffff9c8;
      __y_05._M_str._0_7_ = in_stack_fffffffffffff9d0;
      __y_05._M_str._7_1_ = in_stack_fffffffffffff9d7;
      bVar1 = std::operator==(__x_05,__y_05);
      if ((!bVar1) &&
         (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18),
         !bVar1)) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c0,
                   (char *)in_stack_fffffffffffff9b8);
        __x_07._M_str = (char *)__a;
        __x_07._M_len = (size_t)in_RDI;
        __y_07._M_len._4_4_ = in_stack_fffffffffffff9cc;
        __y_07._M_len._0_4_ = in_stack_fffffffffffff9c8;
        __y_07._M_str._0_7_ = in_stack_fffffffffffff9d0;
        __y_07._M_str._7_1_ = in_stack_fffffffffffff9d7;
        bVar1 = std::operator==(__x_07,__y_07);
        if (bVar1) {
          if (((in_RSI->super_BrokerBase).field_0x294 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),(char *)in_RSI,
                       (allocator<char> *)__a);
            generateJsonErrorResponse(code,(string *)in_stack_fffffffffffffa08);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff9b0);
            std::allocator<char>::~allocator(local_321);
            return (string *)__a;
          }
          ActionMessage::ActionMessage
                    ((ActionMessage *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                     in_stack_fffffffffffff9cc);
          local_3e8 = local_150.gid;
          GlobalFederateId::GlobalFederateId(local_3e4,local_150);
          local_3d8 = local_3e4[0].gid;
          local_3dc = std::__atomic_base<int>::operator++
                                ((__atomic_base<int> *)&in_RSI->queryCounter);
          SmallBuffer::operator=
                    (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)
                            CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::getFuture(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04);
          BrokerBase::addActionMessage(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
          local_3f9 = 0;
          std::
          future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          get((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_RDI);
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::finishedWithValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                              in_stack_fffffffffffff9fc);
          local_e4 = 1;
          local_3f9 = 1;
          std::
          future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x5fd186);
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff9b0);
          return (string *)__a;
        }
        local_410 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_18._M_len;
        local_408 = local_18._M_str;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c0,
                   (char *)in_stack_fffffffffffff9b8);
        __x_08._M_str = (char *)__a;
        __x_08._M_len = (size_t)in_RDI;
        __y_08._M_len._4_4_ = in_stack_fffffffffffff9cc;
        __y_08._M_len._0_4_ = in_stack_fffffffffffff9c8;
        __y_08._M_str._0_7_ = in_stack_fffffffffffff9d0;
        __y_08._M_str._7_1_ = in_stack_fffffffffffff9d7;
        bVar1 = std::operator==(__x_08,__y_08);
        if (!bVar1) {
          local_430 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_18._M_len;
          local_428 = local_18._M_str;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c0,
                     (char *)in_stack_fffffffffffff9b8);
          __x_09._M_str = (char *)__a;
          __x_09._M_len = (size_t)in_RDI;
          __y_09._M_len._4_4_ = in_stack_fffffffffffff9cc;
          __y_09._M_len._0_4_ = in_stack_fffffffffffff9c8;
          __y_09._M_str._0_7_ = in_stack_fffffffffffff9d0;
          __y_09._M_str._7_1_ = in_stack_fffffffffffff9d7;
          bVar1 = std::operator==(__x_09,__y_09);
          if (!bVar1) {
            ActionMessage::ActionMessage
                      ((ActionMessage *)
                       CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                       in_stack_fffffffffffff9cc);
            GlobalFederateId::GlobalFederateId
                      ((GlobalFederateId *)&stack0xfffffffffffffa24,local_150);
            std::__atomic_base<int>::operator++((__atomic_base<int> *)&in_RSI->queryCounter);
            SmallBuffer::operator=
                      (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)
                              CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
            string1._M_str = (char *)in_stack_fffffffffffff9c0;
            string1._M_len = (size_t)in_stack_fffffffffffff9b8;
            ActionMessage::setStringData((ActionMessage *)in_stack_fffffffffffff9b0,string1);
            gmlc::concurrency::
            DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_18._M_len,in_stack_fffffffffffffa04);
            transmitToParent(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
            std::
            future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::get((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_RDI);
            gmlc::concurrency::
            DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::finishedWithValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                in_stack_fffffffffffff9fc);
            local_e4 = 1;
            std::
            future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x5fd5a2);
            ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff9b0);
            return (string *)__a;
          }
        }
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                   in_stack_fffffffffffff9cc);
        GlobalFederateId::GlobalFederateId(local_4fc,local_150);
        local_4f0 = local_4fc[0].gid;
        local_4f4 = std::__atomic_base<int>::operator++((__atomic_base<int> *)&in_RSI->queryCounter)
        ;
        SmallBuffer::operator=
                  (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::getFuture(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04);
        transmitToParent(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        get((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_RDI);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::finishedWithValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                            in_stack_fffffffffffff9fc);
        local_e4 = 1;
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x5fd3f4);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff9b0);
        return (string *)__a;
      }
    }
    local_1c0 = local_28;
    local_1b8 = local_20;
    request_00._M_str = in_stack_fffffffffffffd10;
    request_00._M_len = in_stack_fffffffffffffd08;
    quickBrokerQueries_abi_cxx11_(in_stack_fffffffffffffd00,request_00);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5fcc07);
    if (bVar1) {
      local_1d0 = local_28;
      local_1c8 = local_20;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c0,
                 (char *)in_stack_fffffffffffff9b8);
      __x_06._M_str = (char *)__a;
      __x_06._M_len = (size_t)in_RDI;
      __y_06._M_len._4_4_ = in_stack_fffffffffffff9cc;
      __y_06._M_len._0_4_ = in_stack_fffffffffffff9c8;
      __y_06._M_str._0_7_ = in_stack_fffffffffffff9d0;
      __y_06._M_str._7_1_ = in_stack_fffffffffffff9d7;
      bVar1 = std::operator==(__x_06,__y_06);
      if (bVar1) {
        in_stack_fffffffffffff9b0 =
             (BrokerBase *)
             getAddress_abi_cxx11_
                       ((CoreBroker *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0))
        ;
        generateJsonQuotedString((string *)in_RDI);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9b0);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
        local_e4 = 1;
      }
      else {
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                   in_stack_fffffffffffff9cc);
        GlobalFederateId::GlobalFederateId(local_2bc,local_150);
        local_2a8 = local_2bc[0].gid;
        local_2b0 = local_2bc[0].gid;
        local_2b4 = std::__atomic_base<int>::operator++((__atomic_base<int> *)&in_RSI->queryCounter)
        ;
        SmallBuffer::operator=
                  (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::getFuture(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04);
        BrokerBase::addActionMessage(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        get((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_RDI);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::finishedWithValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                            in_stack_fffffffffffff9fc);
        local_e4 = 1;
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x5fcea3);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff9b0);
      }
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
      local_e4 = 1;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b0);
    return (string *)__a;
  }
  local_40 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_18._M_len;
  local_38 = local_18._M_str;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c0,
             (char *)in_stack_fffffffffffff9b8);
  __x._M_str = (char *)__a;
  __x._M_len = (size_t)in_RDI;
  __y._M_len._4_4_ = in_stack_fffffffffffff9cc;
  __y._M_len._0_4_ = in_stack_fffffffffffff9c8;
  __y._M_str._0_7_ = in_stack_fffffffffffff9d0;
  __y._M_str._7_1_ = in_stack_fffffffffffff9d7;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    local_60 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_18._M_len;
    local_58 = local_18._M_str;
    getIdentifier_abi_cxx11_(in_RSI);
    local_70 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff9b0);
    __x_00._M_str = (char *)__a;
    __x_00._M_len = (size_t)in_RDI;
    __y_00._M_len._4_4_ = in_stack_fffffffffffff9cc;
    __y_00._M_len._0_4_ = in_stack_fffffffffffff9c8;
    __y_00._M_str._0_7_ = in_stack_fffffffffffff9d0;
    __y_00._M_str._7_1_ = in_stack_fffffffffffff9d7;
    bVar1 = std::operator==(__x_00,__y_00);
    if ((!bVar1) &&
       (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), !bVar1
       )) {
      local_80 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_18._M_len;
      local_78 = local_18._M_str;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c0,
                 (char *)in_stack_fffffffffffff9b8);
      __x_01._M_str = (char *)__a;
      __x_01._M_len = (size_t)in_RDI;
      __y_01._M_len._4_4_ = in_stack_fffffffffffff9cc;
      __y_01._M_len._0_4_ = in_stack_fffffffffffff9c8;
      __y_01._M_str._0_7_ = in_stack_fffffffffffff9d0;
      __y_01._M_str._7_1_ = in_stack_fffffffffffff9d7;
      bVar1 = std::operator==(__x_01,__y_01);
      if ((!bVar1) ||
         (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9b8),
         !bVar1)) {
        local_a0 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_18._M_len;
        local_98 = local_18._M_str;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c0,
                   (char *)in_stack_fffffffffffff9b8);
        __x_02._M_str = (char *)__a;
        __x_02._M_len = (size_t)in_RDI;
        __y_02._M_len._4_4_ = in_stack_fffffffffffff9cc;
        __y_02._M_len._0_4_ = in_stack_fffffffffffff9c8;
        __y_02._M_str._0_7_ = in_stack_fffffffffffff9d0;
        __y_02._M_str._7_1_ = in_stack_fffffffffffff9d7;
        bVar1 = std::operator==(__x_02,__y_02);
        if ((!bVar1) ||
           (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9b8),
           !bVar1)) goto LAB_005fca0a;
      }
    }
  }
  local_e0 = local_28;
  local_d8 = local_20;
  request._M_str = in_stack_fffffffffffffd10;
  request._M_len = in_stack_fffffffffffffd08;
  quickBrokerQueries_abi_cxx11_(in_stack_fffffffffffffd00,request);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5fc86f);
  if (bVar1) {
    local_f8 = local_28;
    local_f0 = local_20;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9c0,
               (char *)in_stack_fffffffffffff9b8);
    __x_03._M_str = (char *)__a;
    __x_03._M_len = (size_t)in_RDI;
    __y_03._M_len._4_4_ = in_stack_fffffffffffff9cc;
    __y_03._M_len._0_4_ = in_stack_fffffffffffff9c8;
    __y_03._M_str._0_7_ = in_stack_fffffffffffff9d0;
    __y_03._M_str._7_1_ = in_stack_fffffffffffff9d7;
    bVar1 = std::operator==(__x_03,__y_03);
    if (bVar1) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      isRoot((CoreBroker *)0x5fc91e);
      BrokerBase::addBaseInformation
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,(bool)in_stack_fffffffffffffa87
                );
      this_00 = CLI::std::
                __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x5fc955);
      LogManager::getLogBuffer(this_00);
      bufferToJson((LogBuffer *)CONCAT44(in_stack_fffffffffffffa24.gid,in_stack_fffffffffffffa20),
                   (json *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
      fileops::generateJsonString
                ((json *)in_stack_fffffffffffff9b8,SUB81((ulong)in_stack_fffffffffffff9b0 >> 0x38,0)
                );
      local_e4 = 1;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff9b0);
    }
    else {
      local_e4 = 0;
    }
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
    local_e4 = 1;
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b0);
  if (local_e4 != 0) {
    return (string *)__a;
  }
LAB_005fca0a:
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),(char *)in_RSI,
             (allocator<char> *)__a);
  generateJsonErrorResponse(code,(string *)in_stack_fffffffffffffa08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b0);
  std::allocator<char>::~allocator(local_149);
  return (string *)__a;
}

Assistant:

std::string CoreBroker::query(std::string_view target,
                              std::string_view queryStr,
                              HelicsSequencingModes mode)
{
    if (getBrokerState() >= BrokerState::TERMINATING) {
        if (target == "broker" || target == getIdentifier() || target.empty() ||
            (target == "root" && _isRoot) || (target == "federation" && _isRoot)) {
            auto res = quickBrokerQueries(queryStr);
            if (!res.empty()) {
                return res;
            }
            if (queryStr == "logs") {
                nlohmann::json base;
                addBaseInformation(base, !isRoot());
                bufferToJson(mLogManager->getLogBuffer(), base);
                return fileops::generateJsonString(base);
            }
        }
        return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Broker has terminated");
    }
    auto gid = global_id.load();
    if (target == "broker" || target == getIdentifier() || target.empty()) {
        auto res = quickBrokerQueries(queryStr);
        if (!res.empty()) {
            return res;
        }
        if (queryStr == "address") {
            res = generateJsonQuotedString(getAddress());
            return res;
        }
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = querycmd.dest_id = gid;
        auto index = ++queryCounter;
        querycmd.messageID = index;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(index);
        addActionMessage(std::move(querycmd));
        auto ret = queryResult.get();
        activeQueries.finishedWithValue(index);
        return ret;
    }
    if (target == "parent") {
        if (isRootc) {
            return generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND,
                                             "broker has no parent");  // LCOV_EXCL_LINE
        }
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = gid;
        querycmd.messageID = ++queryCounter;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(querycmd.messageID);
        addActionMessage(querycmd);
        auto ret = queryResult.get();
        activeQueries.finishedWithValue(querycmd.messageID);
        return ret;
    }
    if ((target == "root") || (target == "rootbroker")) {
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = gid;
        auto index = ++queryCounter;
        querycmd.messageID = index;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(querycmd.messageID);
        transmitToParent(std::move(querycmd));

        auto ret = queryResult.get();
        activeQueries.finishedWithValue(index);
        return ret;
    }

    ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_QUERY : CMD_QUERY_ORDERED);
    querycmd.source_id = gid;
    auto index = ++queryCounter;
    querycmd.messageID = index;
    querycmd.payload = queryStr;
    querycmd.setStringData(target);
    auto queryResult = activeQueries.getFuture(querycmd.messageID);
    transmitToParent(std::move(querycmd));

    auto ret = queryResult.get();
    activeQueries.finishedWithValue(index);
    return ret;
}